

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O0

int TestDynamicLoader(char *libname,char *symbol,int r1,int r2,int r3)

{
  int iVar1;
  ostream *poVar2;
  LibraryHandle lib;
  char *pcVar3;
  SymbolPointer p_Var4;
  allocator local_99;
  int s;
  SymbolPointer local_78;
  SymbolPointer f;
  allocator local_59;
  string local_58;
  LibraryHandle local_38;
  LibraryHandle l;
  int local_28;
  int r3_local;
  int r2_local;
  int r1_local;
  char *symbol_local;
  char *libname_local;
  
  l._4_4_ = r3;
  local_28 = r2;
  r3_local = r1;
  _r2_local = symbol;
  symbol_local = libname;
  poVar2 = std::operator<<((ostream *)&std::cerr,"Testing: ");
  poVar2 = std::operator<<(poVar2,symbol_local);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar3 = symbol_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,pcVar3,&local_59);
  lib = cmsys::DynamicLoader::OpenLibrary(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar3 = _r2_local;
  local_38 = lib;
  if (((r3_local == 0) || (lib != (LibraryHandle)0x0)) &&
     ((r3_local != 0 || (lib == (LibraryHandle)0x0)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&s,pcVar3,&local_99);
    p_Var4 = cmsys::DynamicLoader::GetSymbolAddress(lib,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_78 = p_Var4;
    if (((local_28 == 0) || (p_Var4 != (SymbolPointer)0x0)) &&
       ((local_28 != 0 || (p_Var4 == (SymbolPointer)0x0)))) {
      iVar1 = cmsys::DynamicLoader::CloseLibrary(local_38);
      if (((l._4_4_ == 0) || (iVar1 != 0)) && ((l._4_4_ != 0 || (iVar1 == 0)))) {
        libname_local._4_4_ = 0;
      }
      else {
        pcVar3 = cmsys::DynamicLoader::LastError();
        poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        libname_local._4_4_ = 1;
      }
    }
    else {
      pcVar3 = cmsys::DynamicLoader::LastError();
      poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      libname_local._4_4_ = 1;
    }
  }
  else {
    pcVar3 = cmsys::DynamicLoader::LastError();
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    libname_local._4_4_ = 1;
  }
  return libname_local._4_4_;
}

Assistant:

int TestDynamicLoader(const char* libname, const char* symbol, int r1, int r2, int r3)
{
  std::cerr << "Testing: " << libname << std::endl;
  kwsys::DynamicLoader::LibraryHandle l
    = kwsys::DynamicLoader::OpenLibrary(libname);
  // If result is incompatible with expectation just fails (xor):
  if( (r1 && !l) || (!r1 && l) )
    {
    std::cerr
      << kwsys::DynamicLoader::LastError() << std::endl;
    return 1;
    }
  kwsys::DynamicLoader::SymbolPointer f
    = kwsys::DynamicLoader::GetSymbolAddress(l, symbol);
  if( (r2 && !f) || (!r2 && f) )
    {
    std::cerr
      << kwsys::DynamicLoader::LastError() << std::endl;
    return 1;
    }
#ifndef __APPLE__
  int s = kwsys::DynamicLoader::CloseLibrary(l);
  if( (r3 && !s) || (!r3 && s) )
    {
    std::cerr
      << kwsys::DynamicLoader::LastError() << std::endl;
    return 1;
    }
#else
  (void)r3;
#endif
  return 0;
}